

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateExtensionRegistrationCode
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  long lVar2;
  long lVar3;
  undefined1 auStack_58 [40];
  
  lVar2 = 0;
  for (lVar3 = 0; pDVar1 = this->descriptor_, lVar3 < *(int *)(pDVar1 + 0x68); lVar3 = lVar3 + 1) {
    ExtensionGenerator::ExtensionGenerator
              ((ExtensionGenerator *)auStack_58,
               (FieldDescriptor *)(*(long *)(pDVar1 + 0x70) + lVar2));
    ExtensionGenerator::GenerateRegistrationCode((ExtensionGenerator *)auStack_58,printer);
    ExtensionGenerator::~ExtensionGenerator((ExtensionGenerator *)auStack_58);
    lVar2 = lVar2 + 0x78;
  }
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(pDVar1 + 0x38); lVar2 = lVar2 + 1) {
    MessageGenerator((MessageGenerator *)auStack_58,(Descriptor *)(*(long *)(pDVar1 + 0x40) + lVar3)
                    );
    GenerateExtensionRegistrationCode((MessageGenerator *)auStack_58,printer);
    FieldGeneratorMap::~FieldGeneratorMap((FieldGeneratorMap *)(auStack_58 + 8));
    pDVar1 = this->descriptor_;
    lVar3 = lVar3 + 0x78;
  }
  return;
}

Assistant:

void MessageGenerator::GenerateExtensionRegistrationCode(io::Printer* printer) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ExtensionGenerator(descriptor_->extension(i))
      .GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    MessageGenerator(descriptor_->nested_type(i))
      .GenerateExtensionRegistrationCode(printer);
  }
}